

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_traits.h
# Opt level: O0

MessageType __thiscall
google::protobuf::json_internal::ClassifyMessage(json_internal *this,string_view name)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  basic_string_view<char,_std::char_traits<char>_> __x_06;
  basic_string_view<char,_std::char_traits<char>_> __x_07;
  basic_string_view<char,_std::char_traits<char>_> __x_08;
  basic_string_view<char,_std::char_traits<char>_> __x_09;
  basic_string_view<char,_std::char_traits<char>_> __x_10;
  basic_string_view<char,_std::char_traits<char>_> __x_11;
  basic_string_view<char,_std::char_traits<char>_> __x_12;
  basic_string_view<char,_std::char_traits<char>_> __x_13;
  basic_string_view<char,_std::char_traits<char>_> __x_14;
  basic_string_view<char,_std::char_traits<char>_> __x_15;
  string_view prefix;
  string_view text;
  char *pcVar1;
  bool bVar2;
  size_type sVar3;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_288;
  char *local_278;
  char *local_270;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_268;
  char *local_258;
  char *local_250;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_248;
  char *local_238;
  char *local_230;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_228;
  char *local_218;
  char *local_210;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_208;
  char *local_1f8;
  char *local_1f0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_1e8;
  char *local_1d8;
  char *local_1d0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_1c8;
  char *local_1b8;
  char *local_1b0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_1a8;
  char *local_198;
  char *local_190;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_188;
  char *local_178;
  char *local_170;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_168;
  char *local_158;
  char *local_150;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_148;
  char *local_138;
  char *local_130;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_128;
  char *local_118;
  char *local_110;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_108;
  char *local_f8;
  char *local_f0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_e8;
  char *local_d8;
  char *local_d0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_c8;
  char *local_b8;
  char *local_b0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_a8;
  char *local_98;
  char *local_90;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_88;
  char *local_78;
  char *local_70;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  undefined8 local_58;
  char *local_50;
  json_internal *local_48;
  char *local_40;
  undefined1 local_38 [8];
  string_view kWellKnownPkg;
  string_view name_local;
  
  local_40 = (char *)name._M_len;
  local_38 = (undefined1  [8])0x10;
  kWellKnownPkg._M_len = (size_t)anon_var_dwarf_21dbfd;
  local_58 = 0x10;
  local_50 = "google.protobuf.";
  text._M_str = local_40;
  text._M_len = (size_t)this;
  prefix._M_str = "google.protobuf.";
  prefix._M_len = 0x10;
  local_48 = this;
  kWellKnownPkg._M_str = (char *)this;
  bVar2 = absl::lts_20240722::StartsWith(text,prefix);
  if (!bVar2) {
    return kNotWellKnown;
  }
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_38);
  local_68 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                       ((basic_string_view<char,_std::char_traits<char>_> *)&kWellKnownPkg._M_str,
                        sVar3,0xffffffffffffffff);
  pcVar1 = local_68._M_str;
  kWellKnownPkg._M_str = (char *)local_68._M_len;
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&kWellKnownPkg._M_str);
  switch(sVar3) {
  case 3:
    local_78 = kWellKnownPkg._M_str;
    local_70 = pcVar1;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_88,"Any");
    __x_15._M_str = local_70;
    __x_15._M_len = (size_t)local_78;
    bVar2 = std::operator==(__x_15,local_88);
    if (bVar2) {
      return kAny;
    }
    break;
  default:
    break;
  case 5:
    local_98 = kWellKnownPkg._M_str;
    local_90 = pcVar1;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a8,"Value");
    __x_14._M_str = local_90;
    __x_14._M_len = (size_t)local_98;
    bVar2 = std::operator==(__x_14,local_a8);
    if (bVar2) {
      return kValue;
    }
    break;
  case 6:
    local_b8 = kWellKnownPkg._M_str;
    local_b0 = pcVar1;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_c8,"Struct");
    __x_13._M_str = local_b0;
    __x_13._M_len = (size_t)local_b8;
    bVar2 = std::operator==(__x_13,local_c8);
    if (bVar2) {
      return kStruct;
    }
    break;
  case 8:
    local_d8 = kWellKnownPkg._M_str;
    local_d0 = pcVar1;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_e8,"Duration");
    __x_12._M_str = local_d0;
    __x_12._M_len = (size_t)local_d8;
    bVar2 = std::operator==(__x_12,local_e8);
    if (bVar2) {
      return kDuration;
    }
    break;
  case 9:
    local_f8 = kWellKnownPkg._M_str;
    local_f0 = pcVar1;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_108,"BoolValue")
    ;
    __x_11._M_str = local_f0;
    __x_11._M_len = (size_t)local_f8;
    bVar2 = std::operator==(__x_11,local_108);
    if (bVar2) {
      return kWrapper;
    }
    local_118 = kWellKnownPkg._M_str;
    local_110 = pcVar1;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_128,"NullValue")
    ;
    __x_10._M_str = local_110;
    __x_10._M_len = (size_t)local_118;
    bVar2 = std::operator==(__x_10,local_128);
    if (bVar2) {
      return kNull;
    }
    local_138 = kWellKnownPkg._M_str;
    local_130 = pcVar1;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_148,"ListValue")
    ;
    __x_09._M_str = local_130;
    __x_09._M_len = (size_t)local_138;
    bVar2 = std::operator==(__x_09,local_148);
    if (bVar2) {
      return kList;
    }
    local_158 = kWellKnownPkg._M_str;
    local_150 = pcVar1;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_168,"Timestamp")
    ;
    __x_08._M_str = local_150;
    __x_08._M_len = (size_t)local_158;
    bVar2 = std::operator==(__x_08,local_168);
    if (bVar2) {
      return kTimestamp;
    }
    local_178 = kWellKnownPkg._M_str;
    local_170 = pcVar1;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_188,"FieldMask")
    ;
    __x_07._M_str = local_170;
    __x_07._M_len = (size_t)local_178;
    bVar2 = std::operator==(__x_07,local_188);
    if (bVar2) {
      return kFieldMask;
    }
    break;
  case 10:
    local_198 = kWellKnownPkg._M_str;
    local_190 = pcVar1;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_1a8,"BytesValue");
    __x_06._M_str = local_190;
    __x_06._M_len = (size_t)local_198;
    bVar2 = std::operator==(__x_06,local_1a8);
    if (!bVar2) {
      local_1b8 = kWellKnownPkg._M_str;
      local_1b0 = pcVar1;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_1c8,"FloatValue");
      __x_05._M_str = local_1b0;
      __x_05._M_len = (size_t)local_1b8;
      bVar2 = std::operator==(__x_05,local_1c8);
      if (!bVar2) {
        local_1d8 = kWellKnownPkg._M_str;
        local_1d0 = pcVar1;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_1e8,"Int32Value");
        __x_04._M_str = local_1d0;
        __x_04._M_len = (size_t)local_1d8;
        bVar2 = std::operator==(__x_04,local_1e8);
        if (!bVar2) {
          local_1f8 = kWellKnownPkg._M_str;
          local_1f0 = pcVar1;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_208,"Int64Value");
          __x_03._M_str = local_1f0;
          __x_03._M_len = (size_t)local_1f8;
          bVar2 = std::operator==(__x_03,local_208);
          if (!bVar2) {
            return kNotWellKnown;
          }
        }
      }
    }
    return kWrapper;
  case 0xb:
    local_218 = kWellKnownPkg._M_str;
    local_210 = pcVar1;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_228,"DoubleValue");
    __x_02._M_str = local_210;
    __x_02._M_len = (size_t)local_218;
    bVar2 = std::operator==(__x_02,local_228);
    if (!bVar2) {
      local_238 = kWellKnownPkg._M_str;
      local_230 = pcVar1;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_248,"StringValue");
      __x_01._M_str = local_230;
      __x_01._M_len = (size_t)local_238;
      bVar2 = std::operator==(__x_01,local_248);
      if (!bVar2) {
        local_258 = kWellKnownPkg._M_str;
        local_250 = pcVar1;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_268,"UInt32Value");
        __x_00._M_str = local_250;
        __x_00._M_len = (size_t)local_258;
        bVar2 = std::operator==(__x_00,local_268);
        if (!bVar2) {
          local_278 = kWellKnownPkg._M_str;
          local_270 = pcVar1;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_288,"UInt64Value");
          __x._M_str = local_270;
          __x._M_len = (size_t)local_278;
          bVar2 = std::operator==(__x,local_288);
          if (!bVar2) {
            return kNotWellKnown;
          }
        }
      }
    }
    return kWrapper;
  }
  return kNotWellKnown;
}

Assistant:

inline MessageType ClassifyMessage(absl::string_view name) {
  constexpr absl::string_view kWellKnownPkg = "google.protobuf.";
  if (!absl::StartsWith(name, kWellKnownPkg)) {
    return MessageType::kNotWellKnown;
  }
  name = name.substr(kWellKnownPkg.size());

  switch (name.size()) {
    case 3:
      if (name == "Any") {
        return MessageType::kAny;
      }
      break;
    case 5:
      if (name == "Value") {
        return MessageType::kValue;
      }
      break;
    case 6:
      if (name == "Struct") {
        return MessageType::kStruct;
      }
      break;
    case 8:
      if (name == "Duration") {
        return MessageType::kDuration;
      }
      break;
    case 9:
      if (name == "BoolValue") {
        return MessageType::kWrapper;
      }
      if (name == "NullValue") {
        return MessageType::kNull;
      }
      if (name == "ListValue") {
        return MessageType::kList;
      }
      if (name == "Timestamp") {
        return MessageType::kTimestamp;
      }
      if (name == "FieldMask") {
        return MessageType::kFieldMask;
      }
      break;
    case 10:
      if (name == "BytesValue" || name == "FloatValue" ||
          name == "Int32Value" || name == "Int64Value") {
        return MessageType::kWrapper;
      }
      break;
    case 11:
      if (name == "DoubleValue" || name == "StringValue" ||
          name == "UInt32Value" || name == "UInt64Value") {
        return MessageType::kWrapper;
      }
      break;
    default:
      break;
  }

  return MessageType::kNotWellKnown;
}